

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

Vec_Int_t * Abc_SclFindCriticalCoWindow(SC_Man *p,int Window)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  iVar2 = p->vQue->nSize;
  if (iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  uVar3 = 0xffffffff;
  if (iVar2 != 1) {
    uVar3 = p->vQue->pHeap[1];
  }
  if ((-1 < (int)uVar3) && (pVVar5 = p->pNtk->vCos, (int)uVar3 < pVVar5->nSize)) {
    uVar3 = *(uint *)((long)pVVar5->pArray[uVar3] + 0x10);
    fVar7 = p->pTimes[uVar3].rise;
    fVar8 = p->pTimes[uVar3].fall;
    if (fVar7 <= fVar8) {
      fVar7 = fVar8;
    }
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 100;
    p_00->nSize = 0;
    piVar4 = (int *)malloc(400);
    p_00->pArray = piVar4;
    pVVar5 = p->pNtk->vCos;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        uVar3 = *(uint *)((long)pVVar5->pArray[lVar6] + 0x10);
        fVar8 = p->pTimes[uVar3].rise;
        fVar1 = p->pTimes[uVar3].fall;
        if (fVar8 <= fVar1) {
          fVar8 = fVar1;
        }
        if (((100.0 - (float)Window) * fVar7) / 100.0 <= fVar8) {
          Vec_IntPush(p_00,uVar3);
        }
        lVar6 = lVar6 + 1;
        pVVar5 = p->pNtk->vCos;
      } while (lVar6 < pVVar5->nSize);
    }
    if (0 < p_00->nSize) {
      return p_00;
    }
    __assert_fail("Vec_IntSize(vPivots) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0x6c,"Vec_Int_t *Abc_SclFindCriticalCoWindow(SC_Man *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Int_t * Abc_SclFindCriticalCoWindow( SC_Man * p, int Window )
{
    float fMaxArr = Abc_SclReadMaxDelay( p ) * (100.0 - Window) / 100.0;
    Vec_Int_t * vPivots;
    Abc_Obj_t * pObj;
    int i;
    vPivots = Vec_IntAlloc( 100 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_SclObjTimeMax(p, pObj) >= fMaxArr )
            Vec_IntPush( vPivots, Abc_ObjId(pObj) );
    assert( Vec_IntSize(vPivots) > 0 );
    return vPivots;
}